

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::Utils::texture::get
          (texture *this,GLenum format,GLenum type,GLvoid *out_data)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLvoid *pGVar2;
  sockaddr *__addr;
  GLenum __fd;
  
  pGVar2 = out_data;
  __fd = format;
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  bind(this,__fd,__addr,(socklen_t)pGVar2);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xaa0))(0xde1,0,format,type,out_data);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2d4);
  return;
}

Assistant:

void Utils::texture::get(glw::GLenum format, glw::GLenum type, glw::GLvoid* out_data)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bind();

	gl.getTexImage(GL_TEXTURE_2D, 0, format, type, out_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");
}